

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iffl_list.h
# Opt level: O1

void __thiscall
iffl::
flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
::validate_iterator(flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
                    *this,const_iterator *it)

{
  pointer_type pcVar1;
  pointer_type pcVar2;
  buffer_char_pointer pcVar3;
  buffer_char_pointer pcVar4;
  
  pcVar1 = (this->buffer_).v2_.last;
  buffer_t<char>::validate(&(this->buffer_).v2_);
  pcVar2 = (this->buffer_).v2_.last;
  if (pcVar1 == (pointer_type)0x0) {
    if (pcVar2 == (pointer_type)0x0) {
      pcVar4 = (buffer_char_pointer)0x0;
    }
    else {
      pcVar4 = pcVar2 + (*(long *)(pcVar2 + 0x10) + 0x1fU & 0xfffffffffffffff8);
    }
    if (pcVar4 == it->p_) {
      return;
    }
  }
  else {
    if (pcVar2 == (pointer_type)0x0) {
      pcVar4 = (buffer_char_pointer)0x0;
    }
    else {
      pcVar4 = pcVar2 + (*(long *)(pcVar2 + 0x10) + 0x1fU & 0xfffffffffffffff8);
    }
    pcVar3 = it->p_;
    if ((pcVar4 == pcVar3) ||
       (((this->buffer_).v2_.begin <= pcVar3 && (pcVar3 <= (this->buffer_).v2_.last)))) {
      validate_compare_to_all_valid_elements(this,it);
      return;
    }
  }
  std::terminate();
}

Assistant:

void validate_iterator(const_iterator const &it) const noexcept {
        //
        // If we do not have any valid elements then
        // only end iterator is valid.
        // Otherwise iterator should be an end or point somewhere
        // between begin of the buffer and start of the first element
        //
        if (empty_unsafe()) {
            FFL_CODDING_ERROR_IF_NOT(cend() == it);
        } else {
            FFL_CODDING_ERROR_IF_NOT(cend() == it ||
                                     (buff().begin <= it.get_ptr() && it.get_ptr() <= buff().last));
            validate_compare_to_all_valid_elements(it);
        }
    }